

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  E64::sdl2_init();
  machine.turned_on = true;
  E64::stats_t::reset((stats_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  refresh_moment.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  while ((machine.turned_on & 1U) != 0) {
    if (machine.mode == MONITOR) {
      monitor_frame();
    }
    else if (machine.mode == RUNNING) {
      running_frame();
    }
  }
  E64::sdl2_cleanup();
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	E64::sdl2_init();

//	machine.switch_mode(E64::MONITOR);
	machine.turned_on = true;

	stats.reset();
	
	refresh_moment = std::chrono::steady_clock::now();

	while (machine.turned_on) {
		switch (machine.mode) {
			case E64::RUNNING:
				running_frame();
				break;
			case E64::MONITOR:
				monitor_frame();
				break;
		}
	}

	E64::sdl2_cleanup();
	return 0;
}